

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int maybe_start_packet(vorb *f)

{
  byte bVar1;
  uint8 uVar2;
  int iVar3;
  vorb *in_RDI;
  int x;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->next_seg == -1) {
    bVar1 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_stack_ffffffffffffffec = (uint)bVar1;
    if (in_RDI->eof != 0) {
      return 0;
    }
    if (in_stack_ffffffffffffffec != 0x4f) {
      iVar3 = error(in_RDI,VORBIS_missing_capture_pattern);
      return iVar3;
    }
    uVar2 = get8((vorb *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe8));
    if (uVar2 != 'g') {
      iVar3 = error(in_RDI,VORBIS_missing_capture_pattern);
      return iVar3;
    }
    uVar2 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (uVar2 != 'g') {
      iVar3 = error(in_RDI,VORBIS_missing_capture_pattern);
      return iVar3;
    }
    uVar2 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (uVar2 != 'S') {
      iVar3 = error(in_RDI,VORBIS_missing_capture_pattern);
      return iVar3;
    }
    iVar3 = start_page_no_capturepattern
                      ((vorb *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar3 == 0) {
      return 0;
    }
    if ((in_RDI->page_flag & 1) != 0) {
      in_RDI->last_seg = 0;
      in_RDI->bytes_in_seg = '\0';
      iVar3 = error(in_RDI,VORBIS_continued_packet_flag_invalid);
      return iVar3;
    }
  }
  iVar3 = start_packet((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return iVar3;
}

Assistant:

static int maybe_start_packet(vorb *f)
{
   if (f->next_seg == -1) {
      int x = get8(f);
      if (f->eof) return FALSE; // EOF at page boundary is not an error!
      if (0x4f != x      ) return error(f, VORBIS_missing_capture_pattern);
      if (0x67 != get8(f)) return error(f, VORBIS_missing_capture_pattern);
      if (0x67 != get8(f)) return error(f, VORBIS_missing_capture_pattern);
      if (0x53 != get8(f)) return error(f, VORBIS_missing_capture_pattern);
      if (!start_page_no_capturepattern(f)) return FALSE;
      if (f->page_flag & PAGEFLAG_continued_packet) {
         // set up enough state that we can read this packet if we want,
         // e.g. during recovery
         f->last_seg = FALSE;
         f->bytes_in_seg = 0;
         return error(f, VORBIS_continued_packet_flag_invalid);
      }
   }
   return start_packet(f);
}